

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

int __thiscall
cs_impl::any::holder<cs::type_id>::kill(holder<cs::type_id> *this,__pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((DAT_00259cb8 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &allocator + DAT_00259cb8;
    DAT_00259cb8 = DAT_00259cb8 + 1;
    *puVar1 = this;
    return 0x259ab0;
  }
  operator_delete(this,0x18);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}